

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

Real __thiscall NavierStokesBase::volWgtSum(NavierStokesBase *this,string *name,Real time)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pBVar5;
  NavierStokesBase *pNVar6;
  Long LVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  pointer pBVar14;
  long lVar15;
  BoxArray *pBVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  double *__s;
  byte bVar22;
  double dVar23;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> mf;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  pair<int,_amrex::Box> *is;
  MFIter mfi;
  BoxArray baf;
  Real local_228;
  FabArray<amrex::FArrayBox> *local_220;
  NavierStokesBase *local_218;
  FabArray<amrex::FArrayBox> *local_210;
  ulong local_208;
  ulong local_200;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_1f8;
  pointer local_1d8;
  FabArray<amrex::FArrayBox> *local_1d0;
  long local_1c8;
  double local_1c0;
  int local_1b4;
  ulong local_1b0;
  ulong local_1a8;
  Box local_19c;
  BATransformer *local_180;
  ulong local_178;
  long local_170;
  double *local_168;
  pointer local_160;
  long local_158;
  ulong local_150;
  long local_148;
  double *local_140;
  Array4<double> local_138;
  MFIter local_f8;
  BoxArray local_98;
  
  bVar22 = 0;
  (*(this->super_AmrLevel)._vptr_AmrLevel[0x1f])(&local_220,this,name,0);
  local_218 = this;
  if ((this->super_AmrLevel).level <
      *(int *)&(((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.super_AmrInfo.
               field_0x8c) {
    amrex::BoxArray::BoxArray(&local_98);
    pNVar6 = local_218;
    lVar9 = (long)(local_218->super_AmrLevel).level;
    pBVar5 = (((local_218->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.grids.
             super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar14 = pBVar5 + lVar9 + 1;
    pBVar16 = &local_98;
    for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
      *(undefined8 *)&pBVar16->m_bat = *(undefined8 *)&pBVar14->m_bat;
      pBVar14 = (pointer)((long)pBVar14 + ((ulong)bVar22 * -2 + 1) * 8);
      pBVar16 = (BoxArray *)((long)pBVar16 + (ulong)bVar22 * -0x10 + 8);
    }
    local_98.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         pBVar5[lVar9 + 1].m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_98.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &pBVar5[lVar9 + 1].m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    local_98.m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = pBVar5[lVar9 + 1].m_simplified_list.
           super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_98.m_simplified_list.
                super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &pBVar5[lVar9 + 1].m_simplified_list.
                super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    amrex::BoxArray::coarsen(&local_98,&(pNVar6->super_AmrLevel).fine_ratio);
    local_1f8.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f8.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MFIter::MFIter(&local_f8,&local_220->super_FabArrayBase,true);
    if (local_f8.currentIndex < local_f8.endIndex) {
      local_180 = &(local_218->super_AmrLevel).grids.m_bat;
      do {
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_138,local_220,&local_f8);
        local_1b0 = (ulong)(uint)(local_220->super_FabArrayBase).n_comp;
        amrex::BATransformer::operator()
                  (&local_19c,local_180,
                   (Box *)((long)((local_f8.index_map)->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[local_f8.currentIndex] * 0x1c +
                          *(long *)&(((local_218->super_AmrLevel).grids.m_ref.
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        amrex::BoxArray::intersections(&local_98,&local_19c,&local_1f8);
        LVar7 = local_138.jstride;
        local_1d8 = local_1f8.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_160 = local_1f8.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (local_1f8.
            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_1f8.
            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_148 = local_138.kstride;
          local_158 = local_138.nstride;
          local_170 = (long)local_138.begin.y;
          lVar9 = local_138.jstride * 8;
          local_168 = local_138.p + -(long)local_138.begin.x;
          local_178 = (ulong)(uint)-local_138.begin.z;
          do {
            if (0 < (int)local_1b0) {
              uVar1 = (local_1d8->second).smallend.vect[2];
              local_1a8 = (ulong)uVar1;
              local_208 = CONCAT44(local_208._4_4_,(local_1d8->second).bigend.vect[2]);
              iVar2 = (local_1d8->second).bigend.vect[0];
              iVar20 = (local_1d8->second).bigend.vect[1];
              iVar3 = (local_1d8->second).smallend.vect[1];
              iVar4 = (local_1d8->second).smallend.vect[0];
              local_210 = (FabArray<amrex::FArrayBox> *)(long)iVar4;
              local_1c0 = (double)((ulong)(uint)(iVar2 - iVar4) * 8 + 8);
              local_1c8 = CONCAT44(local_1c8._4_4_,iVar20);
              local_1d0 = (FabArray<amrex::FArrayBox> *)
                          CONCAT44(local_1d0._4_4_,(iVar20 - iVar3) + 1);
              local_140 = (double *)((iVar3 - local_170) * lVar9 + (long)local_168);
              local_1b4 = (int)local_178 + uVar1;
              uVar11 = 0;
              do {
                uVar8 = local_1a8;
                iVar20 = local_1b4;
                local_150 = uVar11;
                if ((int)local_1a8 <= (int)local_208) {
                  do {
                    local_200 = uVar8;
                    if (iVar3 <= (int)local_1c8) {
                      __s = local_140 + iVar20 * local_148 + (long)local_210;
                      iVar13 = (int)local_1d0;
                      do {
                        if (iVar4 <= iVar2) {
                          memset(__s,0,(size_t)local_1c0);
                        }
                        __s = __s + LVar7;
                        iVar13 = iVar13 + -1;
                      } while (iVar13 != 0);
                    }
                    uVar8 = (ulong)((int)local_200 + 1);
                    iVar20 = iVar20 + 1;
                  } while ((int)local_200 != (int)local_208);
                }
                uVar11 = local_150 + 1;
                local_210 = (FabArray<amrex::FArrayBox> *)((long)local_210 + local_158);
              } while (uVar11 != local_1b0);
            }
            local_1d8 = local_1d8 + 1;
          } while (local_1d8 != local_160);
        }
        amrex::MFIter::operator++(&local_f8);
      } while (local_f8.currentIndex < local_f8.endIndex);
    }
    amrex::MFIter::~MFIter(&local_f8);
    if (local_1f8.
        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    amrex::BoxArray::~BoxArray(&local_98);
  }
  local_1c0 = (local_218->super_AmrLevel).geom.super_CoordSys.dx[0] *
              (local_218->super_AmrLevel).geom.super_CoordSys.dx[1] *
              (local_218->super_AmrLevel).geom.super_CoordSys.dx[2];
  if ((0.0 < volWgtSum_sub_dz) && (0.0 < volWgtSum_sub_Rcyl)) {
    amrex::Abort_host("EB volWgtSum currently only works over entire cartesian domain.");
  }
  local_1d0 = &local_218->volfrac->super_FabArray<amrex::FArrayBox>;
  local_1f8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_1f8.
                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  local_210 = local_220;
  amrex::MFIter::MFIter((MFIter *)&local_98,&local_220->super_FabArrayBase,true);
  local_228 = 0.0;
  if (local_98.m_bat.m_op.m_bndryReg.m_loshft.vect[2] <
      local_98.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) {
    local_228 = 0.0;
    do {
      amrex::MFIter::growntilebox(&local_19c,(MFIter *)&local_98,(IntVect *)&local_1f8);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&local_f8,local_210,(MFIter *)&local_98);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&local_138,local_1d0,(MFIter *)&local_98);
      lVar9 = (long)local_19c.smallend.vect[2];
      dVar23 = 0.0;
      iVar2 = local_19c.bigend.vect[2];
      if (local_19c.smallend.vect[2] <= local_19c.bigend.vect[2]) {
        local_208 = (ulong)(uint)local_19c.bigend.vect[1];
        lVar10 = (long)local_19c.smallend.vect[1];
        local_1c8 = local_138.kstride * 8;
        iVar2 = local_19c.bigend.vect[2] + 1;
        lVar15 = (lVar10 - local_138.begin.y) * local_138.jstride * 8 +
                 (lVar9 - local_138.begin.z) * local_1c8 + (long)local_19c.smallend.vect[0] * 8 +
                 (long)local_138.begin.x * -8 + (long)local_138.p;
        lVar19 = (lVar10 - local_f8.beginIndex) * (long)local_f8.fabArray * 8 +
                 (lVar9 - local_f8.endIndex) * local_f8.tile_size.vect._0_8_ * 8 +
                 (long)local_19c.smallend.vect[0] * 8 + (long)local_f8.currentIndex * -8 +
                 (long)local_f8.m_fa._M_t.
                       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                       .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
        do {
          lVar12 = lVar19;
          lVar17 = lVar10;
          lVar21 = lVar15;
          if (local_19c.smallend.vect[1] <= local_19c.bigend.vect[1]) {
            do {
              if (local_19c.smallend.vect[0] <= local_19c.bigend.vect[0]) {
                lVar18 = 0;
                do {
                  dVar23 = dVar23 + *(double *)(lVar12 + lVar18 * 8) *
                                    *(double *)(lVar21 + lVar18 * 8) * local_1c0;
                  lVar18 = lVar18 + 1;
                } while ((local_19c.bigend.vect[0] - local_19c.smallend.vect[0]) + 1 != (int)lVar18)
                ;
              }
              lVar17 = lVar17 + 1;
              lVar12 = lVar12 + (long)local_f8.fabArray * 8;
              lVar21 = lVar21 + local_138.jstride * 8;
            } while (local_19c.bigend.vect[1] + 1U != (int)lVar17);
          }
          lVar9 = lVar9 + 1;
          lVar15 = lVar15 + local_1c8;
          lVar19 = lVar19 + local_f8.tile_size.vect._0_8_ * 8;
        } while (iVar2 != (int)lVar9);
      }
      local_200 = CONCAT44(local_200._4_4_,iVar2);
      local_228 = local_228 + dVar23;
      amrex::MFIter::operator++((MFIter *)&local_98);
    } while (local_98.m_bat.m_op.m_bndryReg.m_loshft.vect[2] <
             local_98.m_bat.m_op.m_bndryReg.m_hishft.vect[1]);
  }
  amrex::MFIter::~MFIter((MFIter *)&local_98);
  if (local_220 != (FabArray<amrex::FArrayBox> *)0x0) {
    (*(local_220->super_FabArrayBase)._vptr_FabArrayBase[1])();
  }
  return local_228;
}

Assistant:

Real
NavierStokesBase::volWgtSum (const std::string& name,
                             Real               time)
{
    Real  volwgtsum = 0.0;
    const Real* dx  = geom.CellSize();
    auto        mf  = derive(name,time,0);

    // First, zero covered regions
    if (level < parent->finestLevel())
    {
        BoxArray    baf;
        baf = parent->boxArray(level+1);
        baf.coarsen(fine_ratio);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
{
	std::vector< std::pair<int,Box> > isects;
        for (MFIter mfi(*mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
           auto const& fabarr = mf->array(mfi);
           int          ncomp = mf->nComp();
           baf.intersections(grids[mfi.index()],isects);

	   for (const auto& is : isects)
	   {
	      amrex::ParallelFor(is.second, ncomp, [fabarr]
              AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
              {
                 fabarr(i,j,k,n) = 0.0;
              });
           }
        }
}
    }

    // Use amrex::ReduceSum
    // TODO set the cases for RZ, but it needs the radius to be somewhere in managed memory and so on
    Real vol = D_TERM(dx[0],*dx[1],*dx[2]);
#ifdef AMREX_USE_EB
    if ( (volWgtSum_sub_dz > 0 && volWgtSum_sub_Rcyl > 0) ) {
        amrex::Abort("EB volWgtSum currently only works over entire cartesian domain.");
    }
    Real sm = amrex::ReduceSum(*mf, *volfrac, 0, [vol]
    AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& mf_arr, Array4<Real const> const& vf_arr) -> Real
    {
        Real sum = 0.0;
        AMREX_LOOP_3D(bx, i, j, k,
        {
            sum += mf_arr(i,j,k) * vf_arr(i,j,k) * vol;
        });
        return sum;
    });
#else
    const Real* dom_lo = geom.ProbLo();
    const Real sub_dz = volWgtSum_sub_dz;
    const Real sub_Rcyl = volWgtSum_sub_Rcyl;
    Real sm = amrex::ReduceSum(*mf, 0, [vol, sub_dz, sub_Rcyl, dx, dom_lo]
    AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& mf_arr) -> Real
    {
        Real sum = 0.0;
        if ( sub_dz > 0 && sub_Rcyl > 0 ) {
           // TODO : test this in 2D
           const auto lo = amrex::lbound(bx);
           const auto hi = amrex::ubound(bx);
           for       (int k = lo.z; k <= hi.z; ++k) {
              Real z = dom_lo[2] + (k+0.5_rt) * dx[2];
              if ( z <= sub_dz ) {
                 for    (int j = lo.y; j <= hi.y; ++j) {
                    Real y = dom_lo[1] + (j+0.5_rt) * dx[1];
                    for (int i = lo.x; i <= hi.x; ++i) {
                       Real x = dom_lo[0] + (i+0.5_rt) * dx[0];
                       Real r = std::sqrt(x*x + y*y);
                       if ( r <= sub_Rcyl ) {
                          sum += mf_arr(i,j,k) * vol;
                       }
                    }
                 }
              }
           }
        } else {
           AMREX_LOOP_3D(bx, i, j, k,
           {
               sum += mf_arr(i,j,k) * vol;
           });
        }
        return sum;
    });
#endif

    volwgtsum = sm;

    ParallelDescriptor::ReduceRealSum(volwgtsum);

    return volwgtsum;
}